

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::Block::performLocalNameSearch
          (Block *this,NameSearch *search,Statement *statementToSearchUpTo)

{
  pointer ppVar1;
  Identifier IVar2;
  VariableDeclaration *pVVar3;
  VariableDeclaration *pVVar4;
  pool_ref<soul::AST::Statement> *s;
  pointer ppVar5;
  pool_ptr<soul::AST::VariableDeclaration> v;
  pool_ptr<soul::AST::VariableDeclaration> lastMatch;
  VariableDeclaration *local_50;
  pool_ptr<soul::AST::VariableDeclaration> local_48;
  NameSearch *local_40;
  pool_ref<soul::AST::Statement> local_38;
  
  if (search->findVariables == true) {
    local_40 = search;
    IVar2 = IdentifierPath::getLastPart(&search->partiallyQualifiedPath);
    local_48.object = (VariableDeclaration *)0x0;
    ppVar1 = (this->statements).
             super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pVVar4 = (VariableDeclaration *)0x0;
    for (ppVar5 = (this->statements).
                  super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (ppVar5 != ppVar1 && (ppVar5->object != statementToSearchUpTo)); ppVar5 = ppVar5 + 1) {
      local_38.object = ppVar5->object;
      cast<soul::AST::VariableDeclaration,soul::AST::Statement>((soul *)&local_50,&local_38);
      if ((local_50 != (VariableDeclaration *)0x0) &&
         (pVVar3 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                             ((pool_ptr<soul::AST::VariableDeclaration> *)&local_50),
         (pVVar3->name).name == IVar2.name)) {
        local_48.object = local_50;
        pVVar4 = local_50;
      }
    }
    if (pVVar4 != (VariableDeclaration *)0x0) {
      pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator*(&local_48);
      Scope::NameSearch::addResult(local_40,(ASTObject *)pVVar4);
    }
  }
  return;
}

Assistant:

void performLocalNameSearch (NameSearch& search, const Statement* statementToSearchUpTo) const override
        {
            if (search.findVariables)
            {
                auto name = search.partiallyQualifiedPath.getLastPart();
                pool_ptr<VariableDeclaration> lastMatch;

                for (auto& s : statements)
                {
                    if (s.getPointer() == statementToSearchUpTo)
                        break;

                    if (auto v = cast<VariableDeclaration> (s))
                        if (v->name == name)
                            lastMatch = v;
                }

                if (lastMatch != nullptr)
                    search.addResult (*lastMatch);
            }
        }